

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineBase.cpp
# Opt level: O2

void __thiscall myvk::PipelineBase::~PipelineBase(PipelineBase *this)

{
  PFN_vkDestroyPipeline p_Var1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)&PTR__PipelineBase_00322ee8;
  p_Var1 = vkDestroyPipeline;
  if (this->m_pipeline != (VkPipeline)0x0) {
    iVar2 = (*(((this->m_pipeline_layout_ptr).
                super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_DeviceObjectBase).super_Base._vptr_Base[2])();
    (*p_Var1)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x268),this->m_pipeline,
              (VkAllocationCallbacks *)0x0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_pipeline_layout_ptr).
              super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
              _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

PipelineBase::~PipelineBase() {
	if (m_pipeline)
		vkDestroyPipeline(m_pipeline_layout_ptr->GetDevicePtr()->GetHandle(), m_pipeline, nullptr);
}